

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::split_node
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint index)

{
  float *this_00;
  uint uVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  vq_node *pvVar8;
  uint *puVar9;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar10;
  vq_node *this_01;
  float fVar11;
  float local_1a4;
  float local_19c;
  float local_184;
  float local_164;
  vq_node *right_child_node;
  vq_node *left_child_node;
  uint right_child_index;
  uint left_child_index;
  float variance_delta_thresh;
  float total_variance;
  vec<6U,_float> local_f8;
  double local_e0;
  double right_dist2;
  double left_dist2;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppStack_c8;
  uint weight;
  vec<6U,_float> *v;
  double dStack_b8;
  uint i;
  double right_ttsum;
  double left_ttsum;
  vec<6U,_float> new_right_child;
  vec<6U,_float> new_left_child;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint64 right_weight;
  uint64 left_weight;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  vq_node *parent_node;
  uint index_local;
  clusterizer<crnlib::vec<6U,_float>_> *this_local;
  
  pvVar8 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                     (&this->m_nodes,index);
  uVar4 = vector<unsigned_int>::size(&pvVar8->m_vectors);
  if (uVar4 != 1) {
    vec<6U,_float>::vec((vec<6U,_float> *)(right_child.m_s + 4));
    vec<6U,_float>::vec((vec<6U,_float> *)&left_weight);
    if ((this->m_quick & 1U) == 0) {
      compute_split_pca(this,(vec<6U,_float> *)(right_child.m_s + 4),(vec<6U,_float> *)&left_weight,
                        pvVar8);
    }
    else {
      compute_split_estimate
                (this,(vec<6U,_float> *)(right_child.m_s + 4),(vec<6U,_float> *)&left_weight,pvVar8)
      ;
    }
    right_weight = 0;
    _left_variance = 0;
    right_variance = 1e+10;
    cMaxLoops = 0;
    total_loops = 0;
    fVar5 = 1.12104e-44;
    if ((this->m_quick & 1U) != 0) {
      fVar5 = 2.8026e-45;
    }
    for (new_left_child.m_s[4] = 0.0; (uint)new_left_child.m_s[4] < (uint)fVar5;
        new_left_child.m_s[4] = (float)((int)new_left_child.m_s[4] + 1)) {
      vector<unsigned_int>::resize(&this->m_left_children,0,false);
      vector<unsigned_int>::resize(&this->m_right_children,0,false);
      vec<6U,_float>::vec((vec<6U,_float> *)(new_right_child.m_s + 4),cClear);
      vec<6U,_float>::vec((vec<6U,_float> *)((long)&left_ttsum + 4),cClear);
      right_ttsum = 0.0;
      dStack_b8 = 0.0;
      right_weight = 0;
      _left_variance = 0;
      for (v._4_4_ = 0; uVar1 = v._4_4_, uVar4 = vector<unsigned_int>::size(&pvVar8->m_vectors),
          dVar3 = right_ttsum, uVar1 < uVar4; v._4_4_ = v._4_4_ + 1) {
        puVar9 = vector<unsigned_int>::operator[](&pvVar8->m_vectors,v._4_4_);
        ppStack_c8 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                               (&this->m_training_vecs,*puVar9);
        puVar9 = vector<unsigned_int>::operator[](&pvVar8->m_vectors,v._4_4_);
        ppVar10 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                            (&this->m_training_vecs,*puVar9);
        left_dist2._4_4_ = ppVar10->second;
        fVar11 = vec<6U,_float>::squared_distance
                           ((vec<6U,_float> *)(right_child.m_s + 4),&ppStack_c8->first);
        right_dist2 = (double)fVar11;
        fVar11 = vec<6U,_float>::squared_distance((vec<6U,_float> *)&left_weight,&ppStack_c8->first)
        ;
        local_e0 = (double)fVar11;
        if (local_e0 <= right_dist2) {
          puVar9 = vector<unsigned_int>::operator[](&pvVar8->m_vectors,v._4_4_);
          vector<unsigned_int>::push_back(&this->m_right_children,puVar9);
          crnlib::operator*((vec<6U,_float> *)&variance_delta_thresh,&ppStack_c8->first,
                            (float)left_dist2._4_4_);
          vec<6U,_float>::operator+=
                    ((vec<6U,_float> *)((long)&left_ttsum + 4),
                     (vec<6U,_float> *)&variance_delta_thresh);
          _left_variance = _left_variance + left_dist2._4_4_;
          fVar11 = vec<6U,_float>::dot(&ppStack_c8->first,&ppStack_c8->first);
          dStack_b8 = (double)(fVar11 * (float)left_dist2._4_4_) + dStack_b8;
        }
        else {
          puVar9 = vector<unsigned_int>::operator[](&pvVar8->m_vectors,v._4_4_);
          vector<unsigned_int>::push_back(&this->m_left_children,puVar9);
          crnlib::operator*(&local_f8,&ppStack_c8->first,(float)left_dist2._4_4_);
          vec<6U,_float>::operator+=((vec<6U,_float> *)(new_right_child.m_s + 4),&local_f8);
          right_weight = right_weight + left_dist2._4_4_;
          fVar11 = vec<6U,_float>::dot(&ppStack_c8->first,&ppStack_c8->first);
          right_ttsum = (double)(fVar11 * (float)left_dist2._4_4_) + right_ttsum;
        }
      }
      if ((right_weight == 0) || (_left_variance == 0)) {
        pvVar8->m_unsplittable = true;
        return;
      }
      this_00 = new_right_child.m_s + 4;
      fVar11 = vec<6U,_float>::dot((vec<6U,_float> *)this_00,(vec<6U,_float> *)this_00);
      dVar2 = dStack_b8;
      local_164 = (float)right_weight;
      cMaxLoops = (uint)(float)(dVar3 - (double)(fVar11 / local_164));
      fVar11 = vec<6U,_float>::dot((vec<6U,_float> *)((long)&left_ttsum + 4),
                                   (vec<6U,_float> *)((long)&left_ttsum + 4));
      local_184 = (float)_left_variance;
      total_loops = (uint)(float)(dVar2 - (double)(fVar11 / local_184));
      local_19c = (float)right_weight;
      vec<6U,_float>::operator*=((vec<6U,_float> *)this_00,1.0 / local_19c);
      local_1a4 = (float)_left_variance;
      vec<6U,_float>::operator*=((vec<6U,_float> *)((long)&left_ttsum + 4),1.0 / local_1a4);
      vec<6U,_float>::operator=
                ((vec<6U,_float> *)(right_child.m_s + 4),(vec<6U,_float> *)(new_right_child.m_s + 4)
                );
      vec<6U,_float>::operator=
                ((vec<6U,_float> *)&left_weight,(vec<6U,_float> *)((long)&left_ttsum + 4));
      fVar11 = (float)cMaxLoops + (float)total_loops;
      if ((fVar11 < 1e-05) || ((right_variance - fVar11) / fVar11 < 0.00125)) break;
      right_variance = fVar11;
    }
    uVar4 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::size(&this->m_nodes);
    uVar6 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::size(&this->m_nodes);
    uVar7 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::size(&this->m_nodes);
    pvVar8->m_left = uVar7;
    uVar7 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::size(&this->m_nodes);
    pvVar8->m_right = uVar7 + 1;
    pvVar8->m_codebook_index = this->m_split_index;
    this->m_split_index = this->m_split_index + 1;
    uVar7 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::size(&this->m_nodes);
    vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::resize
              (&this->m_nodes,uVar7 + 2,false);
    pvVar8 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                       (&this->m_nodes,uVar4);
    this_01 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                        (&this->m_nodes,uVar6 + 1);
    vec<6U,_float>::operator=(&pvVar8->m_centroid,(vec<6U,_float> *)(right_child.m_s + 4));
    pvVar8->m_total_weight = right_weight;
    vector<unsigned_int>::swap(&pvVar8->m_vectors,&this->m_left_children);
    pvVar8->m_variance = (float)cMaxLoops;
    uVar7 = vector<unsigned_int>::size(&pvVar8->m_vectors);
    if ((1 < uVar7) && (0.0 < pvVar8->m_variance)) {
      insert_heap(this,uVar4);
    }
    vec<6U,_float>::operator=(&this_01->m_centroid,(vec<6U,_float> *)&left_weight);
    this_01->m_total_weight = _left_variance;
    vector<unsigned_int>::swap(&this_01->m_vectors,&this->m_right_children);
    this_01->m_variance = (float)total_loops;
    uVar4 = vector<unsigned_int>::size(&this_01->m_vectors);
    if ((1 < uVar4) && (0.0 < this_01->m_variance)) {
      insert_heap(this,uVar6 + 1);
    }
  }
  return;
}

Assistant:

void split_node(uint index)
        {
            vq_node& parent_node = m_nodes[index];

            if (parent_node.m_vectors.size() == 1)
            {
                return;
            }

            VectorType left_child, right_child;
            if (m_quick)
            {
                compute_split_estimate(left_child, right_child, parent_node);
            }
            else
            {
                compute_split_pca(left_child, right_child, parent_node);
            }

            uint64 left_weight = 0;
            uint64 right_weight = 0;

            float prev_total_variance = 1e+10f;

            float left_variance = 0.0f;
            float right_variance = 0.0f;

            const uint cMaxLoops = m_quick ? 2 : 8;
            for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
            {
                m_left_children.resize(0);
                m_right_children.resize(0);

                VectorType new_left_child(cClear);
                VectorType new_right_child(cClear);

                double left_ttsum = 0.0f;
                double right_ttsum = 0.0f;

                left_weight = 0;
                right_weight = 0;

                for (uint i = 0; i < parent_node.m_vectors.size(); i++)
                {
                    const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;
                    const uint weight = m_training_vecs[parent_node.m_vectors[i]].second;

                    double left_dist2 = left_child.squared_distance(v);
                    double right_dist2 = right_child.squared_distance(v);

                    if (left_dist2 < right_dist2)
                    {
                        m_left_children.push_back(parent_node.m_vectors[i]);

                        new_left_child += (v * (float)weight);
                        left_weight += weight;

                        left_ttsum += v.dot(v) * weight;
                    }
                    else
                    {
                        m_right_children.push_back(parent_node.m_vectors[i]);

                        new_right_child += (v * (float)weight);
                        right_weight += weight;

                        right_ttsum += v.dot(v) * weight;
                    }
                }

                if ((!left_weight) || (!right_weight))
                {
                    parent_node.m_unsplittable = true;
                    return;
                }

                left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
                right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

                new_left_child *= (1.0f / left_weight);
                new_right_child *= (1.0f / right_weight);

                left_child = new_left_child;
                right_child = new_right_child;

                float total_variance = left_variance + right_variance;
                if (total_variance < .00001f)
                {
                    break;
                }

                //const float variance_delta_thresh = .00001f;
                const float variance_delta_thresh = .00125f;
                if (((prev_total_variance - total_variance) / total_variance) < variance_delta_thresh)
                {
                    break;
                }

                prev_total_variance = total_variance;
            }

            const uint left_child_index = m_nodes.size();
            const uint right_child_index = m_nodes.size() + 1;

            parent_node.m_left = m_nodes.size();
            parent_node.m_right = m_nodes.size() + 1;
            parent_node.m_codebook_index = m_split_index;
            m_split_index++;

            m_nodes.resize(m_nodes.size() + 2);

            // parent_node is invalid now, because m_nodes has been changed

            vq_node& left_child_node = m_nodes[left_child_index];
            vq_node& right_child_node = m_nodes[right_child_index];

            left_child_node.m_centroid = left_child;
            left_child_node.m_total_weight = left_weight;
            left_child_node.m_vectors.swap(m_left_children);
            left_child_node.m_variance = left_variance;
            if ((left_child_node.m_vectors.size() > 1) && (left_child_node.m_variance > 0.0f))
            {
                insert_heap(left_child_index);
            }

            right_child_node.m_centroid = right_child;
            right_child_node.m_total_weight = right_weight;
            right_child_node.m_vectors.swap(m_right_children);
            right_child_node.m_variance = right_variance;
            if ((right_child_node.m_vectors.size() > 1) && (right_child_node.m_variance > 0.0f))
            {
                insert_heap(right_child_index);
            }
        }